

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  TestCaseInfo *pTVar1;
  IStreamingReporter *pIVar2;
  TestRunStats local_790;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  TestCaseStats local_6b8;
  undefined1 local_528 [8];
  Totals deltaTotals;
  TestCaseInfo testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  undefined1 local_2b8 [8];
  ResultBuilder resultBuilder;
  string *message_local;
  RunContext *this_local;
  
  resultBuilder._664_8_ = message;
  makeUnexpectedResultBuilder((ResultBuilder *)local_2b8,this);
  ResultBuilder::setResultType((ResultBuilder *)local_2b8,FatalErrorCondition);
  ResultBuilder::operator<<
            ((ResultBuilder *)local_2b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             resultBuilder._664_8_);
  ResultBuilder::captureExpression((ResultBuilder *)local_2b8);
  handleUnfinishedSections(this);
  pTVar1 = TestCase::getTestCaseInfo(this->m_activeTestCase);
  SectionInfo::SectionInfo
            ((SectionInfo *)&assertions.failedButOk,&pTVar1->lineInfo,&pTVar1->name,
             &pTVar1->description);
  Counts::Counts((Counts *)&testCaseSectionStats.missingAssertions);
  assertions.passed = 1;
  SectionStats::SectionStats
            ((SectionStats *)&testInfo.properties,(SectionInfo *)&assertions.failedButOk,
             (Counts *)&testCaseSectionStats.missingAssertions,0.0,false);
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&testInfo.properties);
  pTVar1 = TestCase::getTestCaseInfo(this->m_activeTestCase);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)&deltaTotals.testCases.failedButOk,pTVar1);
  Totals::Totals((Totals *)local_528);
  deltaTotals.testCases.passed = 1;
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"",&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"",&local_701);
  TestCaseStats::TestCaseStats
            (&local_6b8,(TestCaseInfo *)&deltaTotals.testCases.failedButOk,(Totals *)local_528,
             &local_6d8,&local_700,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_6b8);
  TestCaseStats::~TestCaseStats(&local_6b8);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  (this->m_totals).testCases.failed = (this->m_totals).testCases.failed + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"",&local_729);
  testGroupEnded(this,&local_728,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  TestRunStats::TestRunStats(&local_790,&this->m_runInfo,&this->m_totals,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2,&local_790);
  TestRunStats::~TestRunStats(&local_790);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)&deltaTotals.testCases.failedButOk);
  SectionStats::~SectionStats((SectionStats *)&testInfo.properties);
  SectionInfo::~SectionInfo((SectionInfo *)&assertions.failedButOk);
  ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b8);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }